

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void __thiscall Function_Pool::InputInfo::InputInfo(InputInfo *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0xff;
  in_RDI[2] = 0;
  *(undefined8 *)(in_RDI + 8) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x10) = 0x3ff0000000000000;
  in_RDI[0x18] = 0xff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x126d9b);
  return;
}

Assistant:

InputInfo()
            : minThreshold        ( 0 )
            , maxThreshold        ( 255 )
            , horizontalProjection( false )
            , coefficientA        ( 1 )
            , coefficientGamma    ( 1 )
            , extractChannelId    ( 255 )
        { }